

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

return_of_t<std::__cxx11::basic_string<char>_(int)> * __thiscall
trompeloeil::
return_handler_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/functional/mixins/Pipe.cpp:365:5)>
::call(return_of_t<std::__cxx11::basic_string<char>_(int)> *__return_storage_ptr__,
      return_handler_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_tests_functional_mixins_Pipe_cpp:365:5)>
      *this,trace_agent *agent,call_params_type_t<std::__cxx11::basic_string<char>_(int)> *params)

{
  tuple<int_&> *in_R8;
  call_params_type_t<std::__cxx11::basic_string<char>_(int)> *params_local;
  trace_agent *agent_local;
  return_handler_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_tests_functional_mixins_Pipe_cpp:365:5)>
  *this_local;
  
  trace_return<std::__cxx11::string,CATCH2_INTERNAL_TEST_57()::__0,std::tuple<int&>,void>
            (__return_storage_ptr__,(trompeloeil *)agent,(trace_agent *)&this->field_0x8,
             (anon_class_1_0_00000001_for_func *)params,in_R8);
  return __return_storage_ptr__;
}

Assistant:

return_of_t<Sig>
    call(
      trace_agent& agent,
      call_params_type_t<Sig>& params)
    override
    {
      return trace_return<return_of_t<Sig>>(agent, func, params);
    }